

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg.c
# Opt level: O0

reg_t * reg_acquire(reg_purpose_t purpose,int type,int ver)

{
  reg_t *table_00;
  reg_t *local_28;
  reg_t *ret;
  reg_t *table;
  int ver_local;
  int type_local;
  reg_purpose_t purpose_local;
  
  table_00 = reg_get_table(ver);
  local_28 = reg_acquire_purpose(purpose,type,table_00);
  if (local_28 == (reg_t *)0x0) {
    if (purpose == PURPOSE_EXPR) {
      local_28 = reg_acquire_purpose(PURPOSE_VAR,type,table_00);
    }
    else if (purpose == PURPOSE_VAR) {
      local_28 = reg_acquire_purpose(PURPOSE_EXPR,type,table_00);
    }
  }
  if (local_28 != (reg_t *)0x0) {
    if (purpose == PURPOSE_EXPR) {
      local_28->lock = LOCK_EXPR;
    }
    else if (purpose == PURPOSE_VAR) {
      local_28->lock = LOCK_VAR;
    }
    else {
      local_28->lock = LOCK_OTHER;
    }
  }
  return local_28;
}

Assistant:

reg_t*
reg_acquire(
   reg_purpose_t purpose,
   int type,
   int ver
) {
    reg_t* table = reg_get_table(ver);
    reg_t* ret = reg_acquire_purpose(purpose, type, table);
    if (ret == NULL) {
        /* Try to use a register that's usually for other things. */
        if (purpose == PURPOSE_EXPR)
            ret = reg_acquire_purpose(PURPOSE_VAR, type, table);
        else if (purpose == PURPOSE_VAR)
            ret = reg_acquire_purpose(PURPOSE_EXPR, type, table);
    }

    if (ret) {
        if (purpose == PURPOSE_EXPR)
            ret->lock = LOCK_EXPR;
        else if (purpose == PURPOSE_VAR)
            ret->lock = LOCK_VAR;
        else
            ret->lock = LOCK_OTHER;
    }

    return ret;
}